

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupOrderDfsReverse(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  uint uVar6;
  Gia_Man_t *pNew;
  size_t sVar7;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  Vec_Int_t *pVVar11;
  long lVar12;
  long lVar13;
  
  Gia_ManFillValue(p);
  pNew = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  pNew->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  pNew->pSpec = pcVar8;
  p->pObjs->Value = 0;
  lVar13 = (long)p->vCos->nSize;
  if (0 < lVar13) {
    do {
      if (p->vCos->nSize < lVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCos->pArray[lVar13 + -1];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001d82e4;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManDupOrderDfs_rec(pNew,p,p->pObjs + iVar1);
      bVar5 = 1 < lVar13;
      lVar13 = lVar13 + -1;
    } while (bVar5);
  }
  pVVar11 = p->vCis;
  uVar6 = pVVar11->nSize;
  uVar10 = (ulong)uVar6;
  if (0 < (int)uVar6) {
    lVar13 = 0;
    do {
      uVar6 = (uint)uVar10;
      lVar12 = (long)pVVar11->pArray[lVar13];
      if ((lVar12 < 0) || (p->nObjs <= pVVar11->pArray[lVar13])) {
LAB_001d82e4:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (pGVar3[lVar12].Value == 0xffffffff) {
        pGVar9 = Gia_ManAppendObj(pNew);
        uVar10 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar10 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar10 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = pNew->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar9)) {
LAB_001d8303:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = pNew->pObjs;
        if ((pGVar9 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar9)) goto LAB_001d8303;
        pGVar3[lVar12].Value = (int)((ulong)((long)pGVar9 - (long)pGVar4) >> 2) * 0x55555556;
      }
      lVar13 = lVar13 + 1;
      pVVar11 = p->vCis;
      uVar6 = pVVar11->nSize;
      uVar10 = (ulong)(int)uVar6;
    } while (lVar13 < (long)uVar10);
  }
  if (pNew->vCis->nSize == uVar6) {
    Gia_ManDupRemapCis(pNew,p);
    Gia_ManDupRemapCos(pNew,p);
    Gia_ManDupRemapEquiv(pNew,p);
    Gia_ManSetRegNum(pNew,p->nRegs);
    return pNew;
  }
  __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x1e4,"Gia_Man_t *Gia_ManDupOrderDfsReverse(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupOrderDfsReverse( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCoReverse( p, pObj, i )
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    Gia_ManForEachCi( p, pObj, i )
        if ( !~pObj->Value )
            pObj->Value = Gia_ManAppendCi(pNew);
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(p) );
    Gia_ManDupRemapCis( pNew, p );
    Gia_ManDupRemapCos( pNew, p );
    Gia_ManDupRemapEquiv( pNew, p );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}